

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# budCovQueue.cpp
# Opt level: O2

cl_command_queue
cov::createCommandQueue
          (cl_context context,cl_device_id device,cl_command_queue_properties properties,
          cl_int *errcodeRet)

{
  cl_int cVar1;
  Queue *this;
  
  if (*(cl_device_id *)(context + 0x10) == device) {
    this = (Queue *)operator_new(0x38,(nothrow_t *)&std::nothrow);
    if (this == (Queue *)0x0) {
      cVar1 = -6;
    }
    else {
      Queue::Queue(this,(Context *)context,(Device *)device,properties != 1,properties == 2);
      *(undefined4 *)&this[1].super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>.m_icdTable = 1;
      cVar1 = 0;
      if ((this->super_ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>).m_initSuccess != false)
      goto LAB_001055cc;
      Countable<cov::ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>_&>::release
                ((Countable<cov::ClObject<cov::ObjectMagic,_(cov::ObjectMagic)6>_&> *)this);
      cVar1 = -5;
    }
  }
  else {
    cVar1 = -0x21;
  }
  this = (Queue *)0x0;
LAB_001055cc:
  *errcodeRet = cVar1;
  return (cl_command_queue)this;
}

Assistant:

cl_command_queue createCommandQueue(cl_context context,
                                    cl_device_id device,
                                    cl_command_queue_properties properties,
                                    cl_int* errcodeRet)
{
    auto c = reinterpret_cast<Context*>(context);
    auto d = reinterpret_cast<Device*>(device);
    if (!c->hasDevice(d)) {
        *errcodeRet = CL_INVALID_DEVICE;
        return nullptr;
    }

    bool isOutOfOrder = properties != CL_QUEUE_OUT_OF_ORDER_EXEC_MODE_ENABLE;
    bool enableProfiling = properties == CL_QUEUE_PROFILING_ENABLE;
    auto queue = new(std::nothrow) Countable<Queue>(*c, *d, isOutOfOrder, enableProfiling);
    if (!queue) {
        *errcodeRet = CL_OUT_OF_HOST_MEMORY;
        return nullptr;
    }

    auto q = reinterpret_cast<Queue*>(queue);
    if (!q->initSuccess()) {
        q->release();
        *errcodeRet = CL_OUT_OF_RESOURCES;
        return nullptr;
    }

    *errcodeRet = CL_SUCCESS;
    return reinterpret_cast<_cl_command_queue*>(q);
}